

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_inotify_poller.cc
# Opt level: O3

void __thiscall
NonrecursiveInotifyPoller::NonrecursiveInotifyPoller(NonrecursiveInotifyPoller *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  
  (this->super_InotifyPoller)._vptr_InotifyPoller =
       (_func_int **)&PTR__NonrecursiveInotifyPoller_00132c80;
  iVar2 = inotify_init1(0x80800);
  this->fd_ = iVar2;
  p_Var1 = &(this->directories_)._M_t._M_impl.super__Rb_tree_header;
  (this->directories_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->directories_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->directories_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->directories_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->directories_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->events_dropped_ = false;
  this->read_buffer_length_ = 0;
  this->read_buffer_offset_ = 0;
  if (-1 < iVar2) {
    return;
  }
  __assert_fail("fd_ >= 0 && \"Failed to create inotify descriptor\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/nonrecursive_inotify_poller.cc"
                ,0x16,"NonrecursiveInotifyPoller::NonrecursiveInotifyPoller()");
}

Assistant:

NonrecursiveInotifyPoller::NonrecursiveInotifyPoller()
    : fd_(inotify_init1(IN_NONBLOCK | IN_CLOEXEC)),
      events_dropped_(false),
      read_buffer_length_(0),
      read_buffer_offset_(0) {
  assert(fd_ >= 0 && "Failed to create inotify descriptor");
}